

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapRiver(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  long lVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v12;
  int v10;
  int v21;
  int v11;
  int v01;
  int *vz2;
  int *vz1;
  int *vz0;
  int mc;
  int err;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_4;
  
  lVar2 = (long)(in_R8D + 2);
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,lVar2,
                       (long)(in_R9D + 2));
  if (local_4 == 0) {
    cVar1 = *(char *)(in_RDI + 8);
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      lVar3 = in_RSI + (local_50 + 1) * lVar2 * 4;
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        local_74 = *(int *)(lVar3 + local_48 * 4);
        local_78 = *(int *)(lVar3 + 4 + local_48 * 4);
        local_7c = *(int *)(lVar3 + 8 + local_48 * 4);
        local_80 = *(int *)(in_RSI + local_50 * lVar2 * 4 + 4 + local_48 * 4);
        local_84 = *(int *)(in_RSI + (local_50 + 2) * lVar2 * 4 + 4 + local_48 * 4);
        if (cVar1 < '\n') {
          if (local_78 != 0) goto LAB_00124df1;
          *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 7;
        }
        else {
          local_74 = reduceID(local_74);
          local_78 = reduceID(local_78);
          local_7c = reduceID(local_7c);
          local_80 = reduceID(local_80);
          local_84 = reduceID(local_84);
LAB_00124df1:
          if ((((local_78 == local_74) && (local_78 == local_80)) && (local_78 == local_84)) &&
             (local_78 == local_7c)) {
            *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 0xffffffff;
          }
          else {
            *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 7;
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapRiver(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    int mc = l->mc;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        for (i = 0; i < w; i++)
        {
            int v01 = vz1[i+0];
            int v11 = vz1[i+1];
            int v21 = vz1[i+2];
            int v10 = vz0[i+1];
            int v12 = vz2[i+1];

            if (mc >= MC_1_7)
            {
                v01 = reduceID(v01);
                v11 = reduceID(v11);
                v21 = reduceID(v21);
                v10 = reduceID(v10);
                v12 = reduceID(v12);
            }
            else if (v11 == 0)
            {
                out[i + j * w] = river;
                continue;
            }

            if (v11 == v01 && v11 == v10 && v11 == v12 && v11 == v21)
            {
                out[i + j * w] = -1;
            }
            else
            {
                out[i + j * w] = river;
            }
        }
    }

    return 0;
}